

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

void __thiscall Clasp::Asp::RuleTransform::Impl::Impl(Impl *this)

{
  undefined8 *in_RDI;
  PodQueue<Clasp::Asp::RuleTransform::Impl::TodoItem> *this_00;
  pod_vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *this_01;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  bk_lib::pod_vector<int,_std::allocator<int>_>::pod_vector(in_stack_ffffffffffffffe0);
  this_01 = (pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
            (in_RDI + 4);
  bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::pod_vector
            (this_01);
  bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
            ((pod_vector<long,_std::allocator<long>_> *)this_01);
  this_00 = (PodQueue<Clasp::Asp::RuleTransform::Impl::TodoItem> *)(in_RDI + 8);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  PodQueue<Clasp::Asp::RuleTransform::Impl::TodoItem>::PodQueue(this_00);
  return;
}

Assistant:

Impl() : adapt_(0), prg_(0) { }